

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O3

BVSparse<Memory::JitArenaAllocator> * __thiscall
BVSparse<Memory::JitArenaAllocator>::CopyNew
          (BVSparse<Memory::JitArenaAllocator> *this,JitArenaAllocator *allocator)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  this_00->head = (Type_conflict)0x0;
  this_00->lastFoundIndex = (Type_conflict)0x0;
  this_00->alloc = allocator;
  this_00->lastUsedNodePrevNextField = (Type)this_00;
  AssertBV<Memory::JitArenaAllocator>(this);
  CopyFromNode<Memory::JitArenaAllocator>(this_00,this->head);
  return this_00;
}

Assistant:

BVSparse<TAllocator> *
BVSparse<TAllocator>::CopyNew(TAllocator* allocator) const
{
    BVSparse * bv = AllocatorNew(TAllocator, allocator, BVSparse<TAllocator>, allocator);
    bv->Copy(this);
    return bv;
}